

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

double calcAbsMax<float>(TWaveformT<float> *waveform)

{
  pointer pfVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  pfVar1 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (uint)((ulong)((long)(waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                               .super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
  if (0 < (int)uVar2) {
    uVar3 = 0;
    dVar5 = 0.0;
    do {
      dVar4 = (double)ABS(pfVar1[uVar3]);
      if (dVar4 <= dVar5) {
        dVar4 = dVar5;
      }
      uVar3 = uVar3 + 1;
      dVar5 = dVar4;
    } while ((uVar2 & 0x7fffffff) != uVar3);
    return dVar4;
  }
  return 0.0;
}

Assistant:

double calcAbsMax(const TWaveformT<TSample> & waveform) {
    double amax = 0.0f;
    for (auto i = 0; i < (int) waveform.size(); ++i) if (std::abs(waveform[i]) > amax) amax = std::abs(waveform[i]);

    return amax;
}